

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_x86.cpp
# Opt level: O2

int __thiscall ncnn::Cast_x86::forward(Cast_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined8 uVar1;
  int iVar2;
  uint _c;
  int _elempack;
  int *piVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  undefined1 auVar7 [12];
  unsigned_short uVar8;
  int i;
  int iVar9;
  ulong uVar10;
  _func_int **pp_Var11;
  int iVar12;
  void *pvVar13;
  _func_int *p_Var14;
  int iVar15;
  undefined4 *puVar16;
  void *pvVar17;
  ulong uVar18;
  size_t sVar19;
  ulong uVar20;
  uint uVar21;
  undefined8 *puVar22;
  ulong uVar23;
  long lVar24;
  undefined1 (*pauVar25) [16];
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  
  p_Var14 = this->_vptr_Cast_x86[-3];
  if (*(int *)(&this->field_0xd0 + (long)p_Var14) == *(int *)(&this->field_0xd4 + (long)p_Var14)) {
    if (top_blob == bottom_blob) {
      return 0;
    }
    piVar3 = bottom_blob->refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    piVar3 = top_blob->refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (top_blob->allocator == (Allocator *)0x0) {
          free(top_blob->data);
        }
        else {
          (*top_blob->allocator->_vptr_Allocator[3])();
        }
      }
    }
    top_blob->cstep = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
    *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
    top_blob->c = 0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->d = 0;
    piVar3 = bottom_blob->refcount;
    top_blob->data = bottom_blob->data;
    top_blob->refcount = piVar3;
    top_blob->elemsize = bottom_blob->elemsize;
    top_blob->elempack = bottom_blob->elempack;
    top_blob->allocator = bottom_blob->allocator;
    iVar12 = bottom_blob->w;
    iVar9 = bottom_blob->h;
    iVar2 = bottom_blob->d;
    top_blob->dims = bottom_blob->dims;
    top_blob->w = iVar12;
    top_blob->h = iVar9;
    top_blob->d = iVar2;
    top_blob->c = bottom_blob->c;
    top_blob->cstep = bottom_blob->cstep;
    return 0;
  }
  iVar12 = bottom_blob->w;
  iVar9 = bottom_blob->h;
  iVar2 = bottom_blob->d;
  _c = bottom_blob->c;
  iVar15 = bottom_blob->dims;
  _elempack = bottom_blob->elempack;
  sVar19 = (size_t)_elempack;
  switch(*(int *)(&this->field_0xd4 + (long)p_Var14)) {
  case 1:
    if (*(int *)(&this->field_0xd0 + (long)p_Var14) == 3) {
      Cast::forward((Cast *)((long)&this->_vptr_Cast_x86 + (long)p_Var14),bottom_blob,top_blob,opt);
    }
    sVar19 = sVar19 * 4;
    break;
  case 2:
  case 4:
    sVar19 = (size_t)(_elempack * 2);
    break;
  case 3:
    break;
  default:
    sVar19 = bottom_blob->elemsize;
  }
  switch(iVar15) {
  case 1:
    Mat::create(top_blob,iVar12,sVar19,_elempack,opt->blob_allocator);
    break;
  case 2:
    Mat::create(top_blob,iVar12,iVar9,sVar19,_elempack,opt->blob_allocator);
    break;
  case 3:
    Mat::create(top_blob,iVar12,iVar9,_c,sVar19,_elempack,opt->blob_allocator);
    break;
  case 4:
    Mat::create(top_blob,iVar12,iVar9,iVar2,_c,sVar19,_elempack,opt->blob_allocator);
  }
  if (top_blob->data == (void *)0x0) {
    return -100;
  }
  if ((long)top_blob->c * top_blob->cstep == 0) {
    return -100;
  }
  pp_Var11 = this->_vptr_Cast_x86;
  p_Var14 = pp_Var11[-3];
  iVar15 = *(int *)(&this->field_0xd0 + (long)p_Var14);
  if (iVar15 == 1) {
    if (*(int *)(&this->field_0xd4 + (long)p_Var14) == 2) {
      iVar15 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
      uVar23 = 0;
      if (iVar15 < 1) {
        iVar15 = 0;
      }
      uVar21 = bottom_blob->c;
      if (bottom_blob->c < 1) {
        uVar21 = 0;
      }
      for (; uVar23 != uVar21; uVar23 = uVar23 + 1) {
        sVar19 = bottom_blob->cstep;
        sVar4 = top_blob->cstep;
        sVar5 = bottom_blob->elemsize;
        pvVar13 = bottom_blob->data;
        sVar6 = top_blob->elemsize;
        pvVar17 = top_blob->data;
        for (lVar24 = 0; iVar15 != (int)lVar24; lVar24 = lVar24 + 1) {
          uVar8 = float32_to_float16(*(float *)((long)pvVar13 + lVar24 * 4 + sVar19 * sVar5 * uVar23
                                               ));
          *(unsigned_short *)((long)pvVar17 + lVar24 * 2 + sVar4 * sVar6 * uVar23) = uVar8;
        }
      }
      pp_Var11 = this->_vptr_Cast_x86;
      p_Var14 = pp_Var11[-3];
      iVar15 = *(int *)(&this->field_0xd0 + (long)p_Var14);
      goto LAB_00448a11;
    }
    iVar15 = 1;
LAB_00448b1a:
    pp_Var11 = pp_Var11 + -3;
  }
  else {
LAB_00448a11:
    if (iVar15 == 2) {
      if (*(int *)(&this->field_0xd4 + (long)p_Var14) != 1) {
        iVar15 = 2;
        goto LAB_00448b1a;
      }
      iVar15 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
      uVar23 = 0;
      if (iVar15 < 1) {
        iVar15 = 0;
      }
      uVar18 = (ulong)(uint)bottom_blob->c;
      if (bottom_blob->c < 1) {
        uVar18 = uVar23;
      }
      for (; uVar23 != uVar18; uVar23 = uVar23 + 1) {
        sVar19 = bottom_blob->cstep;
        sVar4 = top_blob->cstep;
        sVar5 = bottom_blob->elemsize;
        pvVar13 = bottom_blob->data;
        sVar6 = top_blob->elemsize;
        pvVar17 = top_blob->data;
        for (lVar24 = 0; iVar15 != (int)lVar24; lVar24 = lVar24 + 1) {
          fVar26 = float16_to_float32(*(unsigned_short *)
                                       ((long)pvVar13 + lVar24 * 2 + sVar19 * sVar5 * uVar23));
          *(float *)((long)pvVar17 + lVar24 * 4 + sVar4 * sVar6 * uVar23) = fVar26;
        }
      }
      pp_Var11 = this->_vptr_Cast_x86;
      p_Var14 = pp_Var11[-3];
      iVar15 = *(int *)(&this->field_0xd0 + (long)p_Var14);
    }
    pp_Var11 = pp_Var11 + -3;
    if (iVar15 == 3) {
      if (*(int *)(&this->field_0xd4 + (long)p_Var14) != 1) {
        return 0;
      }
      uVar21 = iVar2 * _elempack * iVar9 * iVar12;
      pvVar13 = bottom_blob->data;
      sVar19 = bottom_blob->cstep;
      pvVar17 = top_blob->data;
      sVar4 = top_blob->cstep;
      sVar5 = top_blob->elemsize;
      uVar18 = 0;
      uVar23 = (ulong)uVar21;
      if ((int)uVar21 < 1) {
        uVar23 = uVar18;
      }
      uVar20 = (ulong)_c;
      if ((int)_c < 1) {
        uVar20 = uVar18;
      }
      sVar6 = bottom_blob->elemsize;
      for (; uVar18 != uVar20; uVar18 = uVar18 + 1) {
        for (uVar10 = 0; uVar23 != uVar10; uVar10 = uVar10 + 1) {
          *(float *)((long)pvVar17 + uVar10 * 4) = (float)(int)*(char *)((long)pvVar13 + uVar10);
        }
        pvVar17 = (void *)((long)pvVar17 + sVar4 * sVar5);
        pvVar13 = (void *)((long)pvVar13 + sVar19 * sVar6);
      }
      p_Var14 = *pp_Var11;
      iVar15 = *(int *)(&this->field_0xd0 + (long)p_Var14);
    }
  }
  if (iVar15 == 1) {
    if (*(int *)(&this->field_0xd4 + (long)p_Var14) != 4) {
      return 0;
    }
    iVar12 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
    uVar18 = 0;
    uVar23 = (ulong)(uint)bottom_blob->c;
    if (bottom_blob->c < 1) {
      uVar23 = uVar18;
    }
    for (; uVar18 != uVar23; uVar18 = uVar18 + 1) {
      pvVar13 = bottom_blob->data;
      sVar19 = bottom_blob->elemsize;
      sVar4 = bottom_blob->cstep;
      pauVar25 = (undefined1 (*) [16])(sVar4 * uVar18 * sVar19 + (long)pvVar13);
      pvVar17 = top_blob->data;
      sVar5 = top_blob->elemsize;
      sVar6 = top_blob->cstep;
      puVar16 = (undefined4 *)(sVar6 * uVar18 * sVar5 + (long)pvVar17);
      lVar24 = 0;
      for (iVar9 = 0; iVar9 + 7 < iVar12; iVar9 = iVar9 + 8) {
        auVar27 = pshuflw(*pauVar25,*pauVar25,0xed);
        auVar27 = pshufhw(auVar27,auVar27,0xed);
        auVar28 = pshuflw(pauVar25[1],pauVar25[1],0xed);
        auVar28 = pshufhw(auVar28,auVar28,0xed);
        *puVar16 = auVar27._0_4_;
        puVar16[1] = auVar27._8_4_;
        puVar16[2] = auVar28._0_4_;
        puVar16[3] = auVar28._8_4_;
        pauVar25 = pauVar25 + 2;
        puVar16 = puVar16 + 4;
        lVar24 = lVar24 + 8;
      }
      for (; (int)lVar24 < iVar12; lVar24 = lVar24 + 1) {
        *(undefined2 *)((long)pvVar17 + lVar24 * 2 + sVar6 * sVar5 * uVar18) =
             *(undefined2 *)((long)pvVar13 + lVar24 * 4 + sVar4 * sVar19 * uVar18 + 2);
      }
    }
    p_Var14 = *pp_Var11;
    iVar15 = *(int *)(&this->field_0xd0 + (long)p_Var14);
  }
  if ((iVar15 == 4) && (*(int *)(&this->field_0xd4 + (long)p_Var14) == 1)) {
    iVar12 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
    uVar23 = (ulong)(uint)bottom_blob->c;
    if (bottom_blob->c < 1) {
      uVar23 = 0;
    }
    for (uVar18 = 0; uVar18 != uVar23; uVar18 = uVar18 + 1) {
      pvVar13 = bottom_blob->data;
      sVar19 = bottom_blob->elemsize;
      sVar4 = bottom_blob->cstep;
      puVar22 = (undefined8 *)(sVar4 * uVar18 * sVar19 + (long)pvVar13);
      pvVar17 = top_blob->data;
      sVar5 = top_blob->elemsize;
      sVar6 = top_blob->cstep;
      pauVar25 = (undefined1 (*) [16])(sVar6 * uVar18 * sVar5 + (long)pvVar17);
      lVar24 = 0;
      for (iVar9 = 0; iVar9 + 3 < iVar12; iVar9 = iVar9 + 4) {
        uVar1 = *puVar22;
        auVar7._10_2_ = (short)((ulong)uVar1 >> 0x20);
        auVar7._0_10_ = (unkuint10)0;
        auVar27._2_12_ =
             SUB1612(ZEXT616(CONCAT42(auVar7._8_4_,(short)((ulong)uVar1 >> 0x10))) << 0x30,4);
        auVar27._0_2_ = (short)uVar1;
        auVar27._14_2_ = 0;
        *pauVar25 = auVar27 << 0x10;
        puVar22 = puVar22 + 1;
        pauVar25 = pauVar25 + 1;
        lVar24 = lVar24 + 4;
      }
      for (; (int)lVar24 < iVar12; lVar24 = lVar24 + 1) {
        *(uint *)((long)pvVar17 + lVar24 * 4 + sVar6 * sVar5 * uVar18) =
             (uint)*(ushort *)((long)pvVar13 + lVar24 * 2 + sVar4 * sVar19 * uVar18) << 0x10;
      }
    }
  }
  return 0;
}

Assistant:

int Cast_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (type_from == type_to)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    size_t out_elemsize = elemsize;
    if (type_to == 1)
    {
        if (type_from == 3)
        {
            Cast::forward(bottom_blob, top_blob, opt);
        }

        // float32
        out_elemsize = 4 * elempack;
    }
    else if (type_to == 2)
    {
        // float16
        out_elemsize = 2 * elempack;
    }
    else if (type_to == 3)
    {
        // int8
        out_elemsize = elempack;
    }
    else if (type_to == 4)
    {
        // bfloat16
        out_elemsize = 2 * elempack;
    }

    if (dims == 1)
    {
        top_blob.create(w, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 2)
    {
        top_blob.create(w, h, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 3)
    {
        top_blob.create(w, h, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 4)
    {
        top_blob.create(w, h, d, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int size = w * h * d * elempack;

    if (type_from == 1 && type_to == 2)
    {
        cast_fp32_to_fp16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 2 && type_to == 1)
    {
        cast_fp16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 3 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const signed char* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = (float)ptr[i];
            }
        }
    }

    if (type_from == 1 && type_to == 4)
    {
        cast_fp32_to_bf16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 4 && type_to == 1)
    {
        cast_bf16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    return 0;
}